

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

int __thiscall
TPZSkylMatrix<std::complex<float>_>::Subst_LBackward
          (TPZSkylMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *B)

{
  float fVar1;
  float fVar2;
  _ComplexT _Var3;
  char cVar4;
  complex<float> **ppcVar5;
  complex<float> *pcVar6;
  complex<float> *pcVar7;
  bool bVar8;
  int iVar9;
  undefined4 extraout_var;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  complex<float> *pcVar15;
  undefined8 *puVar16;
  float fVar18;
  undefined8 uVar17;
  float fVar19;
  float fVar20;
  long local_88;
  undefined4 extraout_var_00;
  
  lVar10 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  iVar9 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if (((lVar10 != CONCAT44(extraout_var,iVar9)) ||
      (cVar4 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed,
      cVar4 == '\x03')) || (cVar4 == '\0')) {
    TPZMatrix<std::complex<float>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<float>>::Subst_LBackward(TPZFMatrix<TVar> *) const [TVar = std::complex<float>]"
               ,"TPZSkylMatrix::Subst_LBackward not decomposed properly");
  }
  iVar9 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  lVar10 = CONCAT44(extraout_var_00,iVar9);
  if (1 < lVar10) {
    lVar11 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
    local_88 = lVar10 * 8 + -0x10;
    do {
      lVar12 = lVar10 + -1;
      if (0 < lVar11) {
        lVar13 = 0;
        lVar14 = 0;
        do {
          ppcVar5 = (this->fElem).fStore;
          pcVar6 = ppcVar5[lVar10];
          lVar11 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
          if (lVar11 < lVar10) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar15 = ppcVar5[lVar12] + 1;
          if (pcVar15 < pcVar6) {
            pcVar7 = B->fElem;
            fVar1 = *(float *)&pcVar7[lVar11 * lVar14 + lVar12]._M_value;
            fVar2 = *(float *)((long)&pcVar7[lVar11 * lVar14 + lVar12]._M_value + 4);
            puVar16 = (undefined8 *)((long)&pcVar7->_M_value + lVar11 * lVar13 + local_88);
            do {
              _Var3 = pcVar15->_M_value;
              fVar18 = (float)(_Var3 >> 0x20);
              fVar20 = fVar1 * (float)_Var3 - fVar2 * fVar18;
              fVar19 = fVar1 * fVar18 + fVar2 * (float)_Var3;
              if ((NAN(fVar20)) && (NAN(fVar19))) {
                uVar17 = __mulsc3(_Var3,fVar18);
                fVar20 = (float)uVar17;
                fVar19 = (float)((ulong)uVar17 >> 0x20);
              }
              *puVar16 = CONCAT44((float)((ulong)*puVar16 >> 0x20) - fVar19,(float)*puVar16 - fVar20
                                 );
              pcVar15 = pcVar15 + 1;
              puVar16 = puVar16 + -1;
            } while (pcVar15 < pcVar6);
          }
          lVar14 = lVar14 + 1;
          lVar11 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
          lVar13 = lVar13 + 8;
        } while (lVar14 < lVar11);
      }
      local_88 = local_88 + -8;
      bVar8 = 2 < lVar10;
      lVar10 = lVar12;
    } while (bVar8);
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_LBackward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || !this->fDecomposed || this->fDecomposed == ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_LBackward not decomposed properly");
    
    int64_t Dimension = this->Dim();
    for ( int64_t k = Dimension-1; k > 0; k-- ) {
        for ( int64_t j = 0; j < B->Cols(); j++ ) {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            //		TVar val = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            // substract the column of the skyline matrix from the vector.
            
            TVar val = *BPtr;
            while(elem_ki < end_ki) *--BPtr -= (*elem_ki++) * val;
        }
    }
    return( 1 );
}